

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  pointer *this_00;
  time_point tVar1;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *pvVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  unsigned_long *puVar8;
  pointer pPVar9;
  long lVar10;
  Fatal *pFVar11;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference pbVar12;
  size_type sVar13;
  char *wasm;
  duration wasm_00;
  rep rVar14;
  Name name;
  Name name_00;
  anon_class_16_2_3fe44dcc visitor;
  undefined1 local_7b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass_3;
  iterator __end2_3;
  iterator __begin2_3;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  reference local_770;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *__range2_2;
  anon_class_16_2_032a43cd flush;
  vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> stack;
  WasmValidator local_599;
  Name local_598;
  Fatal local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  Fatal local_3e0;
  WasmValidator local_251;
  duration<long,_std::ratio<1L,_1000000000L>_> local_250;
  duration<double,_std::ratio<1L,_1L>_> local_248;
  duration<double,_std::ratio<1L,_1L>_> diff;
  time_point after;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_228;
  time_point before;
  size_t i;
  stringstream moduleBefore;
  ostream local_208 [376];
  PassRunner *local_90;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *__range2_1;
  char *local_68;
  unsigned_long local_60;
  reference local_58;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  *__range2;
  size_t padding;
  char *what;
  duration<double,_std::ratio<1L,_1L>_> totalTime;
  PassRunner *this_local;
  
  if (((this->ran ^ 0xffU) & 1) == 0) {
    __assert_fail("!ran",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x2b8,"void wasm::PassRunner::run()");
  }
  this->ran = true;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->skippedPasses);
  if ((run()::passDebug == '\0') && (iVar4 = __cxa_guard_acquire(&run()::passDebug), iVar4 != 0)) {
    run::passDebug = getPassDebug();
    __cxa_guard_release(&run()::passDebug);
  }
  if (((((this->options).debug & 1U) == 0) && (run::passDebug != 2)) &&
     ((run::passDebug == 0 || ((this->isNested & 1U) != 0)))) {
    std::vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>::vector
              ((vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)&flush.this);
    __range2_2 = (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                  *)&flush.this;
    flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
    __end2_2 = std::
               vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ::begin(&this->passes);
    pass_2 = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
             std::
             vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ::end(&this->passes);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                               *)&pass_2), bVar3) {
      local_770 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                  ::operator*(&__end2_2);
      pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(local_770);
      uVar5 = (*pPVar9->_vptr_Pass[4])();
      if ((uVar5 & 1) == 0) {
        run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)&__range2_2);
        pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::get(local_770);
        runPass(this,pPVar9);
      }
      else {
        __range2_3 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::get
                                  (local_770);
        std::vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>::push_back
                  ((vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)&flush.this,
                   (value_type *)&__range2_3);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
      ::operator++(&__end2_2);
    }
    run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)&__range2_2);
    std::vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>::~vector
              ((vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)&flush.this);
  }
  else {
    memset(&what,0,8);
    pcVar6 = "passes";
    wasm = "nested passes";
    if ((this->isNested & 1U) != 0) {
      pcVar6 = "nested passes";
    }
    padding = (size_t)pcVar6;
    poVar7 = std::operator<<((ostream *)&std::cerr,"[PassRunner] running ");
    poVar7 = std::operator<<(poVar7,(char *)padding);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    __range2 = (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                *)0x0;
    __end2 = std::
             vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ::begin(&this->passes);
    pass = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
           std::
           vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ::end(&this->passes);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                                       *)&pass), bVar3) {
      local_58 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                 ::operator*(&__end2);
      std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(local_58);
      local_60 = std::__cxx11::string::size();
      puVar8 = std::max<unsigned_long>((unsigned_long *)&__range2,&local_60);
      __range2 = (vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                  *)*puVar8;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((2 < run::passDebug) && ((this->isNested & 1U) == 0)) {
      wasm::Name::Name((Name *)&__range2_1,"before");
      name.super_IString.str._M_str = (char *)this->wasm;
      name.super_IString.str._M_len = (size_t)local_68;
      dumpWasm((wasm *)__range2_1,name,(Module *)wasm);
    }
    __end2_1 = std::
               vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ::begin(&this->passes);
    pass_1 = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)
             std::
             vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ::end(&this->passes);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                               *)&pass_1), bVar3) {
      local_90 = (PassRunner *)
                 __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
                 ::operator*(&__end2_1);
      std::__cxx11::stringstream::stringstream((stringstream *)&i);
      if ((run::passDebug == 2) && ((this->isNested & 1U) == 0)) {
        poVar7 = std::operator<<(local_208,this->wasm);
        std::operator<<(poVar7,'\n');
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"[PassRunner]   running pass: ");
      pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                         ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
      poVar7 = std::operator<<(poVar7,(string *)&pPVar9->name);
      std::operator<<(poVar7,"... ");
      before.__d.__r = (duration)0;
      while( true ) {
        pvVar2 = __range2;
        tVar1.__d.__r = before.__d.__r;
        std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                  ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
        lVar10 = std::__cxx11::string::size();
        wasm_00.__r = (long)pvVar2 - lVar10;
        if ((ulong)wasm_00.__r <= (ulong)tVar1.__d.__r) break;
        std::operator<<((ostream *)&std::cerr,' ');
        before.__d.__r = (duration)((long)before.__d.__r + 1);
      }
      local_228.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                         ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
      uVar5 = (*pPVar9->_vptr_Pass[4])();
      if ((uVar5 & 1) == 0) {
        pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::get
                           ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
        runPass(this,pPVar9);
      }
      else {
        visitor.pass = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)wasm_00.__r;
        visitor.this = local_90;
        wasm::ModuleUtils::iterDefinedFunctions<wasm::PassRunner::run()::__1>
                  ((ModuleUtils *)this->wasm,(Module *)this,visitor);
      }
      diff.__r = (rep)std::chrono::_V2::steady_clock::now();
      local_250.__r =
           (rep_conflict)
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&diff,&local_228);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_248,&local_250);
      rVar14 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_248);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,rVar14);
      poVar7 = std::operator<<(poVar7," seconds.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator+=
                ((duration<double,_std::ratio<1L,_1L>_> *)&what,&local_248);
      if ((((this->options).validate & 1U) != 0) && ((this->isNested & 1U) == 0)) {
        std::operator<<((ostream *)&std::cerr,"[PassRunner]   (validating)\n");
        bVar3 = WasmValidator::validate(&local_251,this->wasm,&this->options);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,this->wasm);
          std::operator<<(poVar7,'\n');
          if (run::passDebug < 2) {
            Fatal::Fatal(&local_588);
            pFVar11 = Fatal::operator<<(&local_588,(char (*) [12])"Last pass (");
            pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                               ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90
                               );
            pFVar11 = Fatal::operator<<(pFVar11,&pPVar9->name);
            Fatal::operator<<(pFVar11,(char (*) [128])
                                      ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                             );
            Fatal::~Fatal(&local_588);
          }
          Fatal::Fatal(&local_3e0);
          pFVar11 = Fatal::operator<<(&local_3e0,(char (*) [12])"Last pass (");
          pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                             ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
          pFVar11 = Fatal::operator<<(pFVar11,&pPVar9->name);
          pFVar11 = Fatal::operator<<(pFVar11,(char (*) [49])
                                              ") broke validation. Here is the module before: \n");
          std::__cxx11::stringstream::str();
          pFVar11 = Fatal::operator<<(pFVar11,&local_400);
          Fatal::operator<<(pFVar11,(char (*) [2])0x214c2d7);
          std::__cxx11::string::~string((string *)&local_400);
          Fatal::~Fatal(&local_3e0);
        }
      }
      if (2 < run::passDebug) {
        pPVar9 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                           ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_90);
        wasm::Name::Name(&local_598,&pPVar9->name);
        name_00.super_IString.str._M_str = (char *)this->wasm;
        name_00.super_IString.str._M_len = (size_t)local_598.super_IString.str._M_str;
        dumpWasm((wasm *)local_598.super_IString.str._M_len,name_00,(Module *)wasm_00.__r);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&i);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_*,_std::vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>_>
      ::operator++(&__end2_1);
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,"[PassRunner] ");
    poVar7 = std::operator<<(poVar7,(char *)padding);
    poVar7 = std::operator<<(poVar7," took ");
    rVar14 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                       ((duration<double,_std::ratio<1L,_1L>_> *)&what);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,rVar14);
    poVar7 = std::operator<<(poVar7," seconds.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    if ((((this->options).validate & 1U) != 0) && ((this->isNested & 1U) == 0)) {
      std::operator<<((ostream *)&std::cerr,"[PassRunner] (final validation)\n");
      bVar3 = WasmValidator::validate(&local_599,this->wasm,&this->options);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,this->wasm);
        std::operator<<(poVar7,'\n');
        this_00 = &stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        Fatal::Fatal((Fatal *)this_00);
        Fatal::operator<<((Fatal *)this_00,(char (*) [32])"final module does not validate\n");
        Fatal::~Fatal((Fatal *)&stack.
                                super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  if ((this->isNested & 1U) == 0) {
    this_01 = &(this->options).passesToSkip;
    __end2_3 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
    pass_3.field_2._8_8_ =
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_01);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_3.
                               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)((long)&pass_3.field_2 + 8)), bVar3) {
      pbVar12 = std::__detail::
                _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                ::operator*(&__end2_3);
      std::__cxx11::string::string((string *)local_7b0,(string *)pbVar12);
      sVar13 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&this->skippedPasses,(key_type *)local_7b0);
      if (sVar13 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"warning: --");
        poVar7 = std::operator<<(poVar7,(string *)local_7b0);
        poVar7 = std::operator<<(poVar7," was requested to be skipped, ");
        std::operator<<(poVar7,"but it was not found in the passes that were run.\n");
      }
      std::__cxx11::string::~string((string *)local_7b0);
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator++(&__end2_3);
    }
  }
  return;
}

Assistant:

void PassRunner::run() {
  assert(!ran);
  ran = true;

  // As we run passes, we'll notice which we skip.
  skippedPasses.clear();

  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }

  if (!isNested) {
    // All the passes the user requested to skip should have been seen, and
    // skipped. If not, the user may have had a typo in the name of a pass to
    // skip, and we will warn. (We don't do this in a nested runner because
    // those are used for various internal tasks inside passes, which would lead
    // to many spurious warnings.)
    for (auto pass : options.passesToSkip) {
      if (!skippedPasses.count(pass)) {
        std::cerr << "warning: --" << pass << " was requested to be skipped, "
                  << "but it was not found in the passes that were run.\n";
      }
    }
  }
}